

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmYield(ExpressionContext *ctx,VmModule *module,ExprYield *node)

{
  VmFunction *pVVar1;
  VmBlock *block_00;
  VmValue *pVVar2;
  VmBlock **ppVVar3;
  uint index;
  VmValue *local_40;
  VmValue *result;
  VmBlock *block;
  VmValue *value;
  ExprYield *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar2 = CompileVm(ctx,module,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  pVVar1 = module->currentFunction;
  index = module->currentFunction->nextRestoreBlock + 1;
  module->currentFunction->nextRestoreBlock = index;
  ppVVar3 = SmallArray<VmBlock_*,_4U>::operator[](&pVVar1->restoreBlocks,index);
  block_00 = *ppVVar3;
  if (node->value->type == ctx->typeVoid) {
    local_40 = anon_unknown.dwarf_1a3010::CreateYield(module,(node->super_ExprBase).source);
  }
  else {
    local_40 = anon_unknown.dwarf_1a3010::CreateYield(module,(node->super_ExprBase).source,pVVar2);
  }
  VmFunction::AddBlock(module->currentFunction,block_00);
  module->currentBlock = block_00;
  pVVar2 = anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,local_40);
  return pVVar2;
}

Assistant:

VmValue* CompileVmYield(ExpressionContext &ctx, VmModule *module, ExprYield *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	if(node->coroutineStateUpdate)
		CompileVm(ctx, module, node->coroutineStateUpdate);

	if(node->closures)
		CompileVm(ctx, module, node->closures);

	VmBlock *block = module->currentFunction->restoreBlocks[++module->currentFunction->nextRestoreBlock];

	VmValue *result = node->value->type == ctx.typeVoid ? CreateYield(module, node->source) : CreateYield(module, node->source, value);

	module->currentFunction->AddBlock(block);
	module->currentBlock = block;

	return CheckType(ctx, node, result);
}